

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_shape_name(parser *p)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  undefined8 *v;
  long lVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar7;
  
  pvVar3 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x118);
  auVar2 = _DAT_00224950;
  lVar4 = 0x27;
  auVar6 = _DAT_002256f0;
  auVar8 = _DAT_00224940;
  do {
    auVar9 = auVar8 ^ auVar2;
    if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7fffffe4) {
      *(undefined2 *)((long)v + lVar4 * 4 + -0xc) = 100;
      *(undefined2 *)((long)v + lVar4 * 4 + -8) = 100;
    }
    auVar9 = auVar6 ^ auVar2;
    if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7fffffe4) {
      *(undefined2 *)((long)v + lVar4 * 4 + -4) = 100;
      *(undefined2 *)((long)v + lVar4 * 4) = 100;
    }
    lVar7 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 4;
    auVar8._8_8_ = lVar7 + 4;
    lVar7 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 4;
    auVar6._8_8_ = lVar7 + 4;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x43);
  *v = pvVar3;
  pcVar5 = parser_getstr(p,"name");
  pcVar5 = string_make(pcVar5);
  v[1] = pcVar5;
  parser_setpriv(p,v);
  uVar1 = z_info->shape_max;
  z_info->shape_max = uVar1 + 1;
  *(uint *)(v + 2) = (uint)uVar1;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_shape_name(struct parser *p) {
	struct player_shape *h = parser_priv(p);
	struct player_shape *shape = mem_zalloc(sizeof *shape);
	int i;

	for (i = 0; i < ELEM_MAX; i++) {
		shape->el_info[i].res_level = RES_LEVEL_BASE;
	}
	shape->next = h;
	shape->name = string_make(parser_getstr(p, "name"));
	parser_setpriv(p, shape);
	shape->sidx = z_info->shape_max++;
	return PARSE_ERROR_NONE;
}